

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_unit.c
# Opt level: O2

int zt_unit_run_by_name(zt_unit *unit,char *name)

{
  char *pcVar1;
  char *__s;
  zt_unit_test *test;
  zt_elist_t *pzVar2;
  int iVar3;
  char **ppcVar4;
  size_t sVar5;
  size_t sVar6;
  zt_unit *unit_00;
  zt_unit_suite *suite;
  char **targetv;
  int count;
  
  ppcVar4 = str_split(name,".",&count);
  iVar3 = -1;
  targetv = ppcVar4;
  if (0xfffffffd < count - 3U) {
    pcVar1 = *ppcVar4;
    sVar5 = strlen(pcVar1);
    suite = (zt_unit_suite *)unit;
    do {
      do {
        suite = (zt_unit_suite *)(suite->suite).next;
        if (suite == (zt_unit_suite *)unit) goto LAB_0011c159;
        __s = suite->name;
        sVar6 = strlen(__s);
      } while (sVar5 != sVar6);
      iVar3 = strncmp(__s,pcVar1,sVar5);
    } while (iVar3 != 0);
    if (count == 1) {
      zt_unit_run_suite(unit,suite);
LAB_0011c109:
      iVar3 = 0;
    }
    else {
      pcVar1 = ppcVar4[1];
      sVar5 = strlen(pcVar1);
      pzVar2 = &suite->tests;
      while (test = (zt_unit_test *)pzVar2->next, test != (zt_unit_test *)&suite->tests) {
        unit_00 = (zt_unit *)test->name;
        sVar6 = strlen((char *)unit_00);
        if (sVar5 == sVar6) {
          iVar3 = strncmp((char *)unit_00,pcVar1,sVar5);
          if (iVar3 == 0) {
            iVar3 = zt_unit_run_test(unit_00,suite,test);
            if (iVar3 == 0) {
              unit->failures = unit->failures + 1;
            }
            else {
              unit->successes = unit->successes + 1;
            }
            goto LAB_0011c109;
          }
        }
        pzVar2 = &test->test;
      }
LAB_0011c159:
      iVar3 = -1;
    }
  }
  str_split_free(&targetv);
  return iVar3;
}

Assistant:

int
zt_unit_run_by_name(struct zt_unit    * unit,
                    char    * name)
{
    int                    count;
    char                 **targetv;
    struct zt_unit_suite * unit_suite = NULL;
    struct zt_unit_test  * unit_test = NULL;
    zt_elist_t           * tmp;
    int                    result = 0;
    size_t                 len;

    targetv = str_split(name, ".", &count);

    if (count <= 0 || count > 2) {
        result = -1;
        goto done;
    }

    len = strlen(targetv[0]);
    zt_elist_for_each(&unit->suites, tmp) {
        unit_suite = zt_elist_data(tmp, struct zt_unit_suite, suite);
        if (len == strlen(unit_suite->name)) {
            if (strncmp(unit_suite->name, targetv[0], len) == 0) {
                break;
            }
        }
        unit_suite = NULL;
    }

    if (unit_suite == NULL) {
        result = -1;
        goto done;
    }

    if (count == 1) {
        result = zt_unit_run_suite(unit, unit_suite);
        goto done;
    }

    len = strlen(targetv[1]);
    zt_elist_for_each(&unit_suite->tests, tmp) {
        unit_test = zt_elist_data(tmp, struct zt_unit_test, test);
        if (len == strlen(unit_test->name)) {
            if (strncmp(unit_test->name, targetv[1], len) == 0) {
                break;
            }
        }
        unit_test = NULL;
    }

    if (unit_test == NULL) {
        result = -1;
        goto done;
    }

    if (zt_unit_run_test(unit, unit_suite, unit_test) == FALSE) {
        unit->failures += 1;
    } else {
        unit->successes += 1;
    }

done:
    str_split_free(&targetv);
    return result;
}